

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O2

string * __thiscall rcg::Buffer::getTLType_abi_cxx11_(string *__return_storage_ptr__,Buffer *this)

{
  shared_ptr<const_rcg::GenTLWrapper> *gentl;
  BUFFER_INFO_CMD in_R9D;
  
  gentl = (shared_ptr<const_rcg::GenTLWrapper> *)Stream::getHandle(this->parent);
  (anonymous_namespace)::getBufferString_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)&this->gentl,gentl,this->buffer,
             (void *)0x8,in_R9D);
  return __return_storage_ptr__;
}

Assistant:

std::string Buffer::getTLType() const
{
  return getBufferString(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_TLTYPE);
}